

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::detail::scoped_dfs_traverser::check_repeat_group_start
          (scoped_dfs_traverser *this,scoped_dfs_traverser *newMatch)

{
  pointer pcVar1;
  group *pgVar2;
  group *pgVar3;
  _Elt_pointer pmVar4;
  bool bVar5;
  
  pgVar2 = group::depth_first_traverser::innermost_repeat_group(&newMatch->pos_);
  if (pgVar2 != (group *)0x0) {
    pgVar3 = group::depth_first_traverser::innermost_repeat_group(&this->lastMatch_);
    bVar5 = true;
    if ((((pgVar3 != pgVar2) || (this->repeatGroupContinues_ != true)) ||
        (newMatch->repeatGroupContinues_ != true)) ||
       (pmVar4 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur,
       pmVar4 == (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)) goto LAB_001087ab;
    pcVar1 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pcVar1 != (this->pos_).stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       (pgVar3 = pcVar1->parent, pgVar2 == pgVar3)) {
      if (pmVar4 == (this->scopes_).c.
                    super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pmVar4 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      bVar5 = pmVar4[-1].context_.cur._M_current ==
              (pgVar3->children_).
              super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001087ab;
    }
  }
  bVar5 = false;
LAB_001087ab:
  this->repeatGroupStarted_ = bVar5;
  this->repeatGroupContinues_ = bVar5;
  return;
}

Assistant:

void check_repeat_group_start(const scoped_dfs_traverser& newMatch)
    {
        const auto newrg = newMatch.innermost_repeat_group();
        if(!newrg) {
            repeatGroupStarted_ = false;
        }
        else if(lastMatch_.innermost_repeat_group() != newrg) {
            repeatGroupStarted_ = true;
        }
        else if(!repeatGroupContinues_ || !newMatch.repeatGroupContinues_) {
            repeatGroupStarted_ = true;
        }
        else {
            //special case: repeat group is outermost group
            //=> we can never really 'leave' and 'reenter' it
            //but if the current scope is the first element, then we are
            //conceptually at a position 'before' the group
            repeatGroupStarted_ = scopes_.empty() || (
                    newrg == pos_.root() &&
                    scopes_.top().param() == &(*pos_.root()->begin()) );
        }
        repeatGroupContinues_ = repeatGroupStarted_;
    }